

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_4,_4> *
tcu::operator*(Matrix<double,_4,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *mtx,double scalar)

{
  undefined1 auVar1 [16];
  double dVar2;
  Matrix<double,_4,_4> *pMVar3;
  int col;
  long lVar4;
  double *pdVar5;
  Matrix<double,_4,_4> *res;
  int row;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  
  pMVar3 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[3].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  pdVar5 = (double *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar4 != lVar7) {
        uVar8 = 0;
      }
      *(undefined8 *)((long)pdVar5 + lVar7) = uVar8;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
    lVar6 = lVar6 + 1;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while (lVar6 != 4);
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pdVar5 = ((Vector<tcu::Vector<double,_4>,_4> *)((Vector<double,_4> *)mtx)->m_data)->m_data[0].
               m_data + lVar6;
      dVar2 = pdVar5[1] * scalar;
      auVar1._8_4_ = SUB84(dVar2,0);
      auVar1._0_8_ = *pdVar5 * scalar;
      auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
      *(undefined1 (*) [16])
       (((Vector<tcu::Vector<double,_4>,_4> *)((Vector<double,_4> *)__return_storage_ptr__)->m_data)
        ->m_data[0].m_data + lVar6) = auVar1;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    mtx = (Matrix<double,_4,_4> *)((long)mtx + 0x20);
    __return_storage_ptr__ = (Matrix<double,_4,_4> *)((long)__return_storage_ptr__ + 0x20);
  } while (lVar4 != 4);
  return pMVar3;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}